

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libcalc.cxx
# Opt level: O0

bool libcalc::isOperator(char symbol)

{
  undefined1 local_a;
  char symbol_local;
  
  local_a = true;
  if (((((symbol != '+') && (local_a = true, symbol != '-')) && (local_a = true, symbol != '*')) &&
      ((local_a = true, symbol != '/' && (local_a = true, symbol != '(')))) &&
     ((local_a = true, symbol != ')' &&
      ((local_a = true, symbol != '%' && (local_a = true, symbol != '^')))))) {
    local_a = symbol == '!';
  }
  return local_a;
}

Assistant:

bool isOperator(const char symbol) {
  return (
      symbol == TOKEN_OPERATOR.ADD ||
      symbol == TOKEN_OPERATOR.SUB ||
      symbol == TOKEN_OPERATOR.MLT ||
      symbol == TOKEN_OPERATOR.DIV ||
      symbol == TOKEN_OPERATOR.LPN ||
      symbol == TOKEN_OPERATOR.RPN ||
      symbol == TOKEN_OPERATOR.MOD ||
      symbol == TOKEN_OPERATOR.PWR ||
      symbol == TOKEN_OPERATOR.FAC
      );
}